

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int16 *
drwav_open_and_read_s16
          (drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,uint *channels,
          uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  drwav_bool32 dVar1;
  undefined4 *in_RCX;
  undefined4 *in_R8;
  undefined8 *in_R9;
  drwav wav;
  void *in_stack_fffffffffffffe28;
  drwav_seek_proc in_stack_fffffffffffffe30;
  drwav_read_proc in_stack_fffffffffffffe38;
  drwav *in_stack_fffffffffffffe40;
  uint *in_stack_fffffffffffffe48;
  uint *in_stack_fffffffffffffe50;
  drwav *in_stack_fffffffffffffe58;
  undefined8 local_8;
  
  if (in_RCX != (undefined4 *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (undefined4 *)0x0) {
    *in_R8 = 0;
  }
  if (in_R9 != (undefined8 *)0x0) {
    *in_R9 = 0;
  }
  dVar1 = drwav_init(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     in_stack_fffffffffffffe28);
  if (dVar1 == 0) {
    local_8 = (drwav_int16 *)0x0;
  }
  else {
    local_8 = drwav__read_and_close_s16
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe48,(drwav_uint64 *)in_stack_fffffffffffffe40);
  }
  return local_8;
}

Assistant:

drwav_int16* drwav_open_and_read_s16(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    if (channels) *channels = 0;
    if (sampleRate) *sampleRate = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init(&wav, onRead, onSeek, pUserData)) {
        return NULL;
    }

    return drwav__read_and_close_s16(&wav, channels, sampleRate, totalSampleCount);
}